

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_env.c
# Opt level: O3

void gravity_env_register_args(gravity_vm *vm,uint32_t _argc,char **_argv)

{
  gravity_list_t *pgVar1;
  gravity_value_t *pgVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  gravity_value_t gVar6;
  
  argc = _argc;
  argv = gravity_list_new(vm,_argc);
  if (_argc != 0) {
    uVar4 = 0;
    do {
      gVar6 = gravity_string_to_value(vm,_argv[uVar4],0xffffffff);
      pgVar1 = argv;
      sVar3 = (argv->array).n;
      if (sVar3 == (argv->array).m) {
        sVar5 = sVar3 * 2;
        if (sVar3 == 0) {
          sVar5 = 8;
        }
        (argv->array).m = sVar5;
        pgVar2 = (gravity_value_t *)realloc((pgVar1->array).p,sVar5 << 4);
        (pgVar1->array).p = pgVar2;
        sVar3 = (pgVar1->array).n;
      }
      else {
        pgVar2 = (argv->array).p;
      }
      (pgVar1->array).n = sVar3 + 1;
      pgVar2[sVar3].isa = gVar6.isa;
      pgVar2[sVar3].field_1.n = (gravity_int_t)gVar6.field_1;
      uVar4 = uVar4 + 1;
    } while (_argc != uVar4);
  }
  return;
}

Assistant:

void gravity_env_register_args(gravity_vm *vm, uint32_t _argc, const char **_argv) {
    argc = _argc;
    argv = gravity_list_new(vm, argc);
    for (int i = 0; i < _argc; ++i) {
        gravity_value_t arg = VALUE_FROM_CSTRING(vm, _argv[i]);
        marray_push(gravity_value_t, argv->array, arg);
    }
}